

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

bool __thiscall roaring::Roaring64Map::removeRunCompression(Roaring64Map *this)

{
  _Bool _Var1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  
  bVar3 = true;
  for (p_Var2 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    _Var1 = roaring_bitmap_remove_run_compression((roaring_bitmap_t *)&p_Var2[1]._M_parent);
    bVar3 = (bool)(bVar3 & _Var1);
  }
  return bVar3;
}

Assistant:

bool removeRunCompression() {
        return std::accumulate(
            roarings.begin(), roarings.end(), true,
            [](bool previous, std::pair<const uint32_t, Roaring> &map_entry) {
                return map_entry.second.removeRunCompression() && previous;
            });
    }